

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decisiontree.cpp
# Opt level: O0

DtreeNode * __thiscall
DecisionTree::buildTree
          (DecisionTree *this,DtreeNode *node,
          vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          *valRange)

{
  bool bVar1;
  reference this_00;
  const_reference pvVar2;
  size_type sVar3;
  DtreeNode *pDVar4;
  pair<int,_double> pVar5;
  vector<double,_std::allocator<double>_> *data;
  iterator __end1;
  iterator __begin1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *__range1;
  set<double,_std::less<double>,_std::allocator<double>_> cls_right;
  set<double,_std::less<double>,_std::allocator<double>_> cls_left;
  pair<int,_double> splitFeatureAndValue;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  *valRange_local;
  DtreeNode *node_local;
  DecisionTree *this_local;
  
  if (node == (DtreeNode *)0x0) {
    return (DtreeNode *)(DecisionTree *)0x0;
  }
  bVar1 = std::vector<int,_std::allocator<int>_>::empty(&this->features);
  if (bVar1) {
    return (DtreeNode *)(DecisionTree *)0x0;
  }
  pVar5 = createSplitFeature(this,valRange);
  node->axis = pVar5.first;
  node->splitVal = pVar5.second;
  std::set<double,_std::less<double>,_std::allocator<double>_>::set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)
             &cls_right._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<double,_std::less<double>,_std::allocator<double>_>::set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)&__range1);
  __end1 = std::
           vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ::begin(valRange);
  data = (vector<double,_std::allocator<double>_> *)
         std::
         vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
         ::end(valRange);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
                                     *)&data), bVar1) {
    this_00 = __gnu_cxx::
              __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
              ::operator*(&__end1);
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)node->axis);
    if ((*pvVar2 != node->splitVal) || (NAN(*pvVar2) || NAN(node->splitVal))) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&node->rightTreeVal,this_00);
      pvVar2 = std::vector<double,_std::allocator<double>_>::back(this_00);
      std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                ((set<double,_std::less<double>,_std::allocator<double>_> *)&__range1,pvVar2);
    }
    else {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::push_back(&node->leftTreeVal,this_00);
      pvVar2 = std::vector<double,_std::allocator<double>_>::back(this_00);
      std::set<double,_std::less<double>,_std::allocator<double>_>::insert
                ((set<double,_std::less<double>,_std::allocator<double>_> *)
                 &cls_right._M_t._M_impl.super__Rb_tree_header._M_node_count,pvVar2);
    }
    __gnu_cxx::
    __normal_iterator<std::vector<double,_std::allocator<double>_>_*,_std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>
    ::operator++(&__end1);
  }
  sVar3 = std::set<double,_std::less<double>,_std::allocator<double>_>::size
                    ((set<double,_std::less<double>,_std::allocator<double>_> *)
                     &cls_right._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar3 < 2) {
    pDVar4 = (DtreeNode *)operator_new(0x70);
    DtreeNode::DtreeNode(pDVar4);
    node->left = pDVar4;
    node->left->isLeaf = true;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(&node->left->leafValue,&node->leftTreeVal);
  }
  else {
    bVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::empty(&node->leftTreeVal);
    if (bVar1) {
      this_local = (DecisionTree *)0x0;
      goto LAB_001042f9;
    }
    pDVar4 = (DtreeNode *)operator_new(0x70);
    DtreeNode::DtreeNode(pDVar4);
    node->left = pDVar4;
    pDVar4 = buildTree(this,node->left,&node->leftTreeVal);
    node->left = pDVar4;
  }
  sVar3 = std::set<double,_std::less<double>,_std::allocator<double>_>::size
                    ((set<double,_std::less<double>,_std::allocator<double>_> *)&__range1);
  if (sVar3 < 2) {
    pDVar4 = (DtreeNode *)operator_new(0x70);
    DtreeNode::DtreeNode(pDVar4);
    node->right = pDVar4;
    node->right->isLeaf = true;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(&node->right->leafValue,&node->rightTreeVal);
  }
  else {
    bVar1 = std::
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::empty(&node->rightTreeVal);
    if (bVar1) {
      this_local = (DecisionTree *)0x0;
      goto LAB_001042f9;
    }
    pDVar4 = (DtreeNode *)operator_new(0x70);
    DtreeNode::DtreeNode(pDVar4);
    node->right = pDVar4;
    pDVar4 = buildTree(this,node->right,&node->rightTreeVal);
    node->right = pDVar4;
  }
  this_local = (DecisionTree *)node;
  if ((node->right == (DtreeNode *)0x0) && (node->left == (DtreeNode *)0x0)) {
    node->isLeaf = true;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::operator=(&node->leafValue,valRange);
  }
LAB_001042f9:
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)&__range1);
  std::set<double,_std::less<double>,_std::allocator<double>_>::~set
            ((set<double,_std::less<double>,_std::allocator<double>_> *)
             &cls_right._M_t._M_impl.super__Rb_tree_header._M_node_count);
  return (DtreeNode *)this_local;
}

Assistant:

DtreeNode* DecisionTree::buildTree(DtreeNode* node, vector<vector<double >>& valRange) {
    if (!node)
        return nullptr;
    if (features.empty())
        return nullptr;
    pair<int, double> splitFeatureAndValue = createSplitFeature(valRange);
    node->axis = splitFeatureAndValue.first;
    node->splitVal = splitFeatureAndValue.second;
    set<double> cls_left;
    set<double> cls_right;
    for (const auto& data : valRange){
        if (data[node->axis] == node->splitVal) {
            node->leftTreeVal.push_back(data);
            cls_left.insert(data.back());
        }
        else {
            node->rightTreeVal.push_back(data);
            cls_right.insert(data.back());
        }
    }
    if (cls_left.size()<=1){//belong to the same class
        node->left = new DtreeNode();
        node->left->isLeaf = true;
        node->left->leafValue = node->leftTreeVal;
    }
    else if (!node->leftTreeVal.empty()) {
        node->left = new DtreeNode();
        node->left = buildTree(node->left, node->leftTreeVal);
    } else{
        return nullptr;
    }
    if (cls_right.size()<=1){//belong to the same class
        node->right = new DtreeNode();
        node->right->isLeaf = true;
        node->right->leafValue = node->rightTreeVal;
    }
    else if (!node->rightTreeVal.empty()){
        node->right = new DtreeNode();
        node->right = buildTree(node->right, node->rightTreeVal);
    } else{
        return nullptr;
    }
    if (!node->right&&!node->left){
        node->isLeaf=true;
        node->leafValue = valRange;
    }
    return node;
}